

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

bool __thiscall Ratio::containsOriginalEEdge(Ratio *this,Bipartition *edge)

{
  bool bVar1;
  long in_RDI;
  PhyloTreeEdge *ratio_edge_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  PhyloTreeEdge *ratio_edge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  PhyloTreeEdge *in_stack_ffffffffffffff48;
  Bipartition *in_stack_ffffffffffffff50;
  Bipartition local_88;
  long local_60;
  reference local_38;
  PhyloTreeEdge *local_30;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_28;
  long local_20;
  
  local_20 = in_RDI + 0x10;
  local_28._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffff48);
  local_30 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      local_60 = in_RDI + 0x28;
      local_88.partition.m_num_bits =
           (size_type)
           std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                     ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                      in_stack_ffffffffffffff48);
      local_88.partition.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                               in_stack_ffffffffffffff48);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                            *)in_stack_ffffffffffffff50,
                           (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                            *)in_stack_ffffffffffffff48);
        if (!bVar1) {
          return false;
        }
        local_88.partition.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)__gnu_cxx::
                      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      ::operator*((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                                   *)&local_88.partition.m_num_bits);
        in_stack_ffffffffffffff50 = &local_88;
        PhyloTreeEdge::getOriginalEdge(in_stack_ffffffffffffff48);
        std::__shared_ptr_access<Bipartition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Bipartition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1fb9a7);
        bVar1 = Bipartition::equals(in_stack_ffffffffffffff50,
                                    &in_stack_ffffffffffffff48->super_Bipartition);
        std::shared_ptr<Bipartition>::~shared_ptr((shared_ptr<Bipartition> *)0x1fb9c7);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator++((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      *)&local_88.partition.m_num_bits);
      }
      return true;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
               ::operator*(&local_28);
    PhyloTreeEdge::getOriginalEdge(in_stack_ffffffffffffff48);
    std::__shared_ptr_access<Bipartition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Bipartition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1fb8ce);
    bVar1 = Bipartition::equals(in_stack_ffffffffffffff50,
                                &in_stack_ffffffffffffff48->super_Bipartition);
    std::shared_ptr<Bipartition>::~shared_ptr((shared_ptr<Bipartition> *)0x1fb8ee);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool Ratio::containsOriginalEEdge(const Bipartition &edge) {

    for (PhyloTreeEdge &ratio_edge : eEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }

    for (PhyloTreeEdge &ratio_edge : fEdges) {
        if (ratio_edge.getOriginalEdge()->equals(edge)) {
            return true;
        }
    }
    return false;
}